

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

char * helicsPublicationGetTag(HelicsPublication pub,char *tagname)

{
  Interface *this;
  size_t sVar1;
  string *psVar2;
  _Alloc_hider _Var3;
  string_view tag;
  
  if ((pub == (HelicsPublication)0x0) || (*pub != -0x684eff5b)) {
    psVar2 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    this = *(Interface **)((long)pub + 0x18);
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    if (tagname != (char *)0x0) {
      sVar1 = strlen(tagname);
      _Var3._M_p = tagname;
    }
    tag._M_str = _Var3._M_p;
    tag._M_len = sVar1;
    psVar2 = helics::Interface::getTag_abi_cxx11_(this,tag);
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* helicsPublicationGetTag(HelicsPublication pub, const char* tagname)
{
    auto* pubObj = verifyPublication(pub, nullptr);
    if (pubObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = pubObj->pubPtr->getTag(AS_STRING_VIEW(tagname));
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}